

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime.cpp
# Opt level: O3

void __thiscall
acto::core::anon_unknown_0::binding_context_t::~binding_context_t(binding_context_t *this)

{
  _Hash_node_base obj;
  __node_base *p_Var1;
  
  p_Var1 = &(this->actors)._M_h._M_before_begin;
  while (p_Var1 = p_Var1->_M_nxt, p_Var1 != (__node_base *)0x0) {
    obj._M_nxt = p_Var1[1]._M_nxt;
    runtime_t::instance();
    runtime_t::deconstruct_object(&runtime_t::instance::value,(object_t *)obj._M_nxt);
  }
  process_actors(this,true);
  std::
  _Hashtable<acto::core::object_t_*,_acto::core::object_t_*,_std::allocator<acto::core::object_t_*>,_std::__detail::_Identity,_std::equal_to<acto::core::object_t_*>,_std::hash<acto::core::object_t_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&(this->actors)._M_h);
  return;
}

Assistant:

~binding_context_t() {
    // Mark all actors as deleting to prevent message loops.
    for (auto* obj : actors) {
      runtime_t::instance()->deconstruct_object(obj);
    }

    process_actors(true);
  }